

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O0

bool __thiscall
draco::KdTreeAttributesDecoder::
DecodePoints<0,draco::PointAttributeVectorOutputIterator<unsigned_int>>
          (KdTreeAttributesDecoder *this,int total_dimensionality,int num_expected_points,
          DecoderBuffer *in_buffer,PointAttributeVectorOutputIterator<unsigned_int> *out_iterator)

{
  bool bVar1;
  uint32_t in_EDX;
  DynamicIntegerPointsKdTreeDecoder<0> decoder;
  undefined4 in_stack_fffffffffffffea0;
  uint32_t in_stack_fffffffffffffea4;
  PointAttributeVectorOutputIterator<unsigned_int> *oit;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  PointAttributeVectorOutputIterator<unsigned_int> local_138 [3];
  uint32_t in_stack_ffffffffffffff9c;
  DynamicIntegerPointsKdTreeDecoder<0> *in_stack_ffffffffffffffa0;
  bool local_1;
  
  oit = local_138;
  DynamicIntegerPointsKdTreeDecoder<0>::DynamicIntegerPointsKdTreeDecoder
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  bVar1 = DynamicIntegerPointsKdTreeDecoder<0>::
          DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                    ((DynamicIntegerPointsKdTreeDecoder<0> *)
                     CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                     (DecoderBuffer *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                     oit,in_stack_fffffffffffffea4);
  if ((bVar1) &&
     (in_stack_fffffffffffffea4 =
           DynamicIntegerPointsKdTreeDecoder<0>::num_decoded_points
                     ((DynamicIntegerPointsKdTreeDecoder<0> *)local_138),
     in_stack_fffffffffffffea4 == in_EDX)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  DynamicIntegerPointsKdTreeDecoder<0>::~DynamicIntegerPointsKdTreeDecoder
            ((DynamicIntegerPointsKdTreeDecoder<0> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  return local_1;
}

Assistant:

bool KdTreeAttributesDecoder::DecodePoints(int total_dimensionality,
                                           int num_expected_points,
                                           DecoderBuffer *in_buffer,
                                           OutIteratorT *out_iterator) {
  DynamicIntegerPointsKdTreeDecoder<level_t> decoder(total_dimensionality);
  if (!decoder.DecodePoints(in_buffer, *out_iterator, num_expected_points) ||
      decoder.num_decoded_points() != num_expected_points) {
    return false;
  }
  return true;
}